

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O1

ggml_backend_reg_t ggml_backend_reg_by_name(char *name)

{
  bool bVar1;
  ggml_backend_reg_t pgVar2;
  char *a;
  size_t index;
  
  get_reg();
  if (get_reg::reg.backends.
      super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      get_reg::reg.backends.
      super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pgVar2 = ggml_backend_reg_get(index);
      a = (char *)ggml_backend_reg_name(pgVar2);
      bVar1 = striequals(a,name);
      if (bVar1) {
        return pgVar2;
      }
      index = index + 1;
      get_reg();
    } while (index < (ulong)((long)get_reg::reg.backends.
                                   super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)get_reg::reg.backends.
                                   super__Vector_base<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return (ggml_backend_reg_t)0x0;
}

Assistant:

ggml_backend_reg_t ggml_backend_reg_by_name(const char * name) {
    for (size_t i = 0; i < ggml_backend_reg_count(); i++) {
        ggml_backend_reg_t reg = ggml_backend_reg_get(i);
        if (striequals(ggml_backend_reg_name(reg), name)) {
            return reg;
        }
    }
    return nullptr;
}